

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp.c
# Opt level: O3

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,float amp,
                        float ampoffset)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (0 < m) {
    uVar6 = 0;
    do {
      dVar9 = cos((double)lsp[uVar6]);
      lsp[uVar6] = (float)(dVar9 + dVar9);
      uVar6 = uVar6 + 1;
    } while ((uint)m != uVar6);
  }
  if (0 < n) {
    iVar3 = 0;
    do {
      lVar7 = (long)iVar3;
      iVar1 = map[lVar7];
      dVar9 = cos((double)((float)iVar1 * (3.1415927 / (float)ln)));
      fVar11 = (float)(dVar9 + dVar9);
      lVar4 = 1;
      fVar8 = 0.5;
      fVar10 = 0.5;
      if (1 < m) {
        lVar4 = 1;
        fVar8 = 0.5;
        fVar10 = 0.5;
        do {
          fVar8 = fVar8 * (fVar11 - (float)*(undefined8 *)(lsp + lVar4 + -1));
          fVar10 = fVar10 * (fVar11 - (float)((ulong)*(undefined8 *)(lsp + lVar4 + -1) >> 0x20));
          lVar4 = lVar4 + 2;
        } while (lVar4 < m);
      }
      if ((int)lVar4 == m) {
        fVar8 = (fVar11 - lsp[(ulong)(uint)m - 1]) * fVar8;
        fVar12 = 4.0 - fVar11 * fVar11;
        fVar8 = fVar8 * fVar8;
      }
      else {
        fVar12 = 2.0 - fVar11;
        fVar8 = (fVar11 + 2.0) * fVar8 * fVar8;
      }
      dVar9 = (double)(fVar12 * fVar10 * fVar10 + fVar8);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar9 = exp(((double)amp / dVar9 - (double)ampoffset) * 0.1151292473077774);
      curve[lVar7] = curve[lVar7] * (float)dVar9;
      iVar3 = iVar3 + 1;
      if (map[lVar7 + 1] == iVar1) {
        lVar7 = lVar7 + 1;
        lVar4 = 0;
        do {
          curve[lVar7 + lVar4] = curve[lVar7 + lVar4] * (float)dVar9;
          lVar5 = lVar4 + 1;
          lVar2 = lVar4 + 1;
          lVar4 = lVar5;
        } while (map[lVar7 + lVar2] == iVar1);
        iVar3 = iVar3 + (int)lVar5;
      }
    } while (iVar3 < n);
  }
  return;
}

Assistant:

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,
                            float amp,float ampoffset){
  int i;
  float wdel=M_PI/ln;
  for(i=0;i<m;i++)lsp[i]=2.f*cos(lsp[i]);

  i=0;
  while(i<n){
    int j,k=map[i];
    float p=.5f;
    float q=.5f;
    float w=2.f*cos(wdel*k);
    for(j=1;j<m;j+=2){
      q *= w-lsp[j-1];
      p *= w-lsp[j];
    }
    if(j==m){
      /* odd order filter; slightly assymetric */
      /* the last coefficient */
      q*=w-lsp[j-1];
      p*=p*(4.f-w*w);
      q*=q;
    }else{
      /* even order filter; still symmetric */
      p*=p*(2.f-w);
      q*=q*(2.f+w);
    }

    q=fromdB(amp/sqrt(p+q)-ampoffset);

    curve[i]*=q;
    while(map[++i]==k)curve[i]*=q;
  }
}